

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1afm.c
# Opt level: O3

FT_Error T1_Get_Track_Kerning(FT_Face face,FT_Fixed ptsize,FT_Int degree,FT_Fixed *kerning)

{
  FT_String *pFVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  FT_Error FVar6;
  FT_Long FVar7;
  FT_Fixed FVar8;
  long lVar9;
  ulong uVar10;
  
  pFVar1 = face[3].style_name;
  if (pFVar1 == (FT_String *)0x0) {
    FVar6 = 6;
  }
  else {
    uVar5 = *(uint *)(pFVar1 + 0x40);
    if (uVar5 != 0) {
      lVar9 = 0x20;
      uVar10 = 0;
      do {
        lVar2 = *(long *)(pFVar1 + 0x38);
        if (*(int *)(lVar2 + -0x20 + lVar9) == degree) {
          lVar3 = *(long *)(lVar2 + -0x18 + lVar9);
          if (ptsize < lVar3) {
            FVar8 = *(FT_Fixed *)(lVar2 + -0x10 + lVar9);
          }
          else {
            lVar4 = *(long *)(lVar2 + -8 + lVar9);
            if (ptsize <= lVar4) {
              FVar7 = FT_MulDiv(ptsize - lVar3,
                                *(long *)(lVar2 + lVar9) - *(long *)(lVar2 + -0x10 + lVar9),
                                lVar4 - lVar3);
              *kerning = FVar7 + *(long *)(lVar2 + -0x10 + lVar9);
              uVar5 = *(uint *)(pFVar1 + 0x40);
              goto LAB_0017699f;
            }
            FVar8 = *(FT_Fixed *)(lVar2 + lVar9);
          }
          *kerning = FVar8;
        }
LAB_0017699f:
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x28;
      } while (uVar10 < uVar5);
    }
    FVar6 = 0;
  }
  return FVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Track_Kerning( FT_Face    face,
                        FT_Fixed   ptsize,
                        FT_Int     degree,
                        FT_Fixed*  kerning )
  {
    AFM_FontInfo  fi = (AFM_FontInfo)( (T1_Face)face )->afm_data;
    FT_UInt       i;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    for ( i = 0; i < fi->NumTrackKern; i++ )
    {
      AFM_TrackKern  tk = fi->TrackKerns + i;


      if ( tk->degree != degree )
        continue;

      if ( ptsize < tk->min_ptsize )
        *kerning = tk->min_kern;
      else if ( ptsize > tk->max_ptsize )
        *kerning = tk->max_kern;
      else
      {
        *kerning = FT_MulDiv( ptsize - tk->min_ptsize,
                              tk->max_kern - tk->min_kern,
                              tk->max_ptsize - tk->min_ptsize ) +
                   tk->min_kern;
      }
    }

    return FT_Err_Ok;
  }